

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O0

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,int socketFd,uint port,ReaderOptions readerOpts)

{
  Client *pCVar1;
  EzRpcContext *this_00;
  LowLevelAsyncIoProvider *pLVar2;
  ReaderOptions readerOpts_00;
  Own<kj::ConnectionReceiver> local_60;
  Promise<unsigned_int> local_50 [2];
  uint local_30;
  uint local_2c;
  uint port_local;
  int socketFd_local;
  Client *mainInterface_local;
  Impl *this_local;
  ReaderOptions readerOpts_local;
  
  this_local = (Impl *)readerOpts.traversalLimitInWords;
  readerOpts_local.traversalLimitInWords._0_4_ = readerOpts.nestingLimit;
  local_30 = port;
  local_2c = socketFd;
  _port_local = mainInterface;
  mainInterface_local = (Client *)this;
  SturdyRefRestorer<capnp::AnyPointer>::SturdyRefRestorer
            (&this->super_SturdyRefRestorer<capnp::AnyPointer>);
  kj::TaskSet::ErrorHandler::ErrorHandler(&this->super_ErrorHandler);
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00cd7b80;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00cd7ba8;
  pCVar1 = kj::mv<capnp::Capability::Client>(mainInterface);
  Capability::Client::Client(&this->mainInterface,pCVar1);
  EzRpcContext::getThreadLocal();
  std::
  map<kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::EzRpcServer::Impl::ExportedCap>_>_>
  ::map(&this->exportMap);
  kj::Promise<unsigned_int>::Promise(local_50,local_30);
  kj::Promise<unsigned_int>::fork((Promise<unsigned_int> *)&this->portPromise);
  kj::Promise<unsigned_int>::~Promise(local_50);
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  this_00 = kj::Own<capnp::EzRpcContext>::operator->(&this->context);
  pLVar2 = EzRpcContext::getLowLevelIoProvider(this_00);
  (*pLVar2->_vptr_LowLevelAsyncIoProvider[5])
            (&local_60,pLVar2,(ulong)local_2c,&(anonymous_namespace)::DUMMY_FILTER,0);
  readerOpts_00.nestingLimit = (int)readerOpts_local.traversalLimitInWords;
  readerOpts_00.traversalLimitInWords = (uint64_t)this_local;
  readerOpts_00._12_4_ = 0;
  acceptLoop(this,&local_60,readerOpts_00);
  kj::Own<kj::ConnectionReceiver>::~Own(&local_60);
  return;
}

Assistant:

Impl(Capability::Client mainInterface, int socketFd, uint port, ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()),
        portPromise(kj::Promise<uint>(port).fork()),
        tasks(*this) {
    acceptLoop(context->getLowLevelIoProvider().wrapListenSocketFd(socketFd, DUMMY_FILTER),
               readerOpts);
  }